

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O0

bool __thiscall QFileDevice::atEnd(QFileDevice *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  QFileDevicePrivate *pQVar4;
  pointer pQVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  QIODevicePrivate *in_RDI;
  QFileDevicePrivate *d;
  QFileDevicePrivate *in_stack_ffffffffffffffd8;
  QIODevicePrivate *this_00;
  bool local_1;
  
  this_00 = in_RDI;
  pQVar4 = d_func((QFileDevice *)0x197c9c);
  bVar1 = QIODevicePrivate::isBufferEmpty(this_00);
  if (bVar1) {
    bVar1 = QIODevice::isOpen((QIODevice *)in_RDI);
    if (bVar1) {
      bVar1 = QFileDevicePrivate::ensureFlushed(in_stack_ffffffffffffffd8);
      if (bVar1) {
        pQVar5 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
                 operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                             *)0x197cf7);
        uVar2 = (*pQVar5->_vptr_QAbstractFileEngine[0x27])(pQVar5,0);
        if ((uVar2 & 1) == 0) {
          iVar3 = (*in_RDI->_vptr_QIODevicePrivate[5])();
          if (CONCAT44(extraout_var,iVar3) < pQVar4->cachedSize) {
            local_1 = false;
          }
          else {
            iVar3 = (*in_RDI->_vptr_QIODevicePrivate[10])();
            local_1 = CONCAT44(extraout_var_00,iVar3) == 0;
          }
        }
        else {
          std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
          operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     0x197d1c);
          local_1 = QAbstractFileEngine::atEnd((QAbstractFileEngine *)0x197d24);
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QFileDevice::atEnd() const
{
    Q_D(const QFileDevice);

    // If there's buffered data left, we're not at the end.
    if (!d->isBufferEmpty())
        return false;

    if (!isOpen())
        return true;

    if (!d->ensureFlushed())
        return false;

    // If the file engine knows best, say what it says.
    if (d->fileEngine->supportsExtension(QAbstractFileEngine::AtEndExtension)) {
        // Check if the file engine supports AtEndExtension, and if it does,
        // check if the file engine claims to be at the end.
        return d->fileEngine->atEnd();
    }

    // if it looks like we are at the end, or if size is not cached,
    // fall through to bytesAvailable() to make sure.
    if (pos() < d->cachedSize)
        return false;

    // Fall back to checking how much is available (will stat files).
    return bytesAvailable() == 0;
}